

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_examples.cpp
# Opt level: O0

bool math::wide_integer::test_uintwide_t_examples(void)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  bool local_d;
  bool local_c;
  bool local_b;
  bool result_is_ok;
  
  bVar1 = example000_numeric_limits();
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example000_numeric_limits     : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,bVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example000a_builtin_convert();
  local_b = false;
  if (!bVar2) {
    bVar1 = local_b;
  }
  local_b = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example000a_builtin_convert   : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_b);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example001_mul_div();
  local_c = false;
  bVar1 = local_b;
  if (!bVar2) {
    bVar1 = local_c;
  }
  local_c = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example001_mul_div            : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_c);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example001a_div_mod();
  local_d = false;
  bVar1 = local_c;
  if (!bVar2) {
    bVar1 = local_d;
  }
  local_d = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example001a_div_mod           : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_d);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example002_shl_shr();
  local_e = false;
  bVar1 = local_d;
  if (!bVar2) {
    bVar1 = local_e;
  }
  local_e = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example002_shl_shr            : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_e);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example003_sqrt();
  local_f = false;
  bVar1 = local_e;
  if (!bVar2) {
    bVar1 = local_f;
  }
  local_f = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example003_sqrt               : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_f);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example003a_cbrt();
  local_10 = false;
  bVar1 = local_f;
  if (!bVar2) {
    bVar1 = local_10;
  }
  local_10 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example003a_cbrt              : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_10);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example004_rootk_pow();
  local_11 = false;
  bVar1 = local_10;
  if (!bVar2) {
    bVar1 = local_11;
  }
  local_11 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example004_rootk_pow          : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_11);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example005_powm();
  local_12 = false;
  bVar1 = local_11;
  if (!bVar2) {
    bVar1 = local_12;
  }
  local_12 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example005_powm               : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_12);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example005a_pow_factors_of_p99();
  local_13 = false;
  bVar1 = local_12;
  if (!bVar2) {
    bVar1 = local_13;
  }
  local_13 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example005a_pow_factors_of_p99: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_13);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example006_gcd();
  local_14 = false;
  bVar1 = local_13;
  if (!bVar2) {
    bVar1 = local_14;
  }
  local_14 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example006_gcd                : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_14);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example007_random_generator();
  local_15 = false;
  bVar1 = local_14;
  if (!bVar2) {
    bVar1 = local_15;
  }
  local_15 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example007_random_generator   : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_15);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example008_miller_rabin_prime();
  local_16 = false;
  bVar1 = local_15;
  if (!bVar2) {
    bVar1 = local_16;
  }
  local_16 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example008_miller_rabin_prime : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_16);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example008a_miller_rabin_prime();
  local_17 = false;
  bVar1 = local_16;
  if (!bVar2) {
    bVar1 = local_17;
  }
  local_17 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example008a_miller_rabin_prime: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_17);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example009_timed_mul();
  local_18 = false;
  bVar1 = local_17;
  if (!bVar2) {
    bVar1 = local_18;
  }
  local_18 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example009_timed_mul          : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_18);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example009a_timed_mul_4_by_4();
  local_19 = false;
  bVar1 = local_18;
  if (!bVar2) {
    bVar1 = local_19;
  }
  local_19 = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example009a_timed_mul_4_by_4  : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_19);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example009b_timed_mul_8_by_8();
  local_1a = false;
  bVar1 = local_19;
  if (!bVar2) {
    bVar1 = local_1a;
  }
  local_1a = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example009b_timed_mul_8_by_8  : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_1a);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example010_uint48_t();
  local_1b = false;
  bVar1 = local_1a;
  if (!bVar2) {
    bVar1 = local_1b;
  }
  local_1b = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example010_uint48_t           : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_1b);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example011_uint24_t();
  local_1c = false;
  bVar1 = local_1b;
  if (!bVar2) {
    bVar1 = local_1c;
  }
  local_1c = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example011_uint24_t           : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_1c);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example012_rsa_crypto();
  local_1d = false;
  bVar1 = local_1c;
  if (!bVar2) {
    bVar1 = local_1d;
  }
  local_1d = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example012_rsa_crypto         : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_1d);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example013_ecdsa_sign_verify();
  local_1e = false;
  bVar1 = local_1d;
  if (!bVar2) {
    bVar1 = local_1e;
  }
  local_1e = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example013_ecdsa_sign_verify  : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_1e);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = example014_pi_spigot_wide();
  local_1f = false;
  bVar1 = local_1e;
  if (!bVar2) {
    bVar1 = local_1f;
  }
  local_1f = bVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "result_is_ok after example014_pi_spigot_wide     : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_1f);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return local_1f;
}

Assistant:

auto ::math::wide_integer::test_uintwide_t_examples() -> bool
#endif
{
  bool result_is_ok = true;

  result_is_ok = (math::wide_integer::example000_numeric_limits     () && result_is_ok); std::cout << "result_is_ok after example000_numeric_limits     : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example000a_builtin_convert   () && result_is_ok); std::cout << "result_is_ok after example000a_builtin_convert   : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example001_mul_div            () && result_is_ok); std::cout << "result_is_ok after example001_mul_div            : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example001a_div_mod           () && result_is_ok); std::cout << "result_is_ok after example001a_div_mod           : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example002_shl_shr            () && result_is_ok); std::cout << "result_is_ok after example002_shl_shr            : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example003_sqrt               () && result_is_ok); std::cout << "result_is_ok after example003_sqrt               : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example003a_cbrt              () && result_is_ok); std::cout << "result_is_ok after example003a_cbrt              : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example004_rootk_pow          () && result_is_ok); std::cout << "result_is_ok after example004_rootk_pow          : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example005_powm               () && result_is_ok); std::cout << "result_is_ok after example005_powm               : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example005a_pow_factors_of_p99() && result_is_ok); std::cout << "result_is_ok after example005a_pow_factors_of_p99: " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example006_gcd                () && result_is_ok); std::cout << "result_is_ok after example006_gcd                : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example007_random_generator   () && result_is_ok); std::cout << "result_is_ok after example007_random_generator   : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example008_miller_rabin_prime () && result_is_ok); std::cout << "result_is_ok after example008_miller_rabin_prime : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example008a_miller_rabin_prime() && result_is_ok); std::cout << "result_is_ok after example008a_miller_rabin_prime: " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example009_timed_mul          () && result_is_ok); std::cout << "result_is_ok after example009_timed_mul          : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example009a_timed_mul_4_by_4  () && result_is_ok); std::cout << "result_is_ok after example009a_timed_mul_4_by_4  : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example009b_timed_mul_8_by_8  () && result_is_ok); std::cout << "result_is_ok after example009b_timed_mul_8_by_8  : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example010_uint48_t           () && result_is_ok); std::cout << "result_is_ok after example010_uint48_t           : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example011_uint24_t           () && result_is_ok); std::cout << "result_is_ok after example011_uint24_t           : " << std::boolalpha << result_is_ok << std::endl;
  #if !(defined(_MSC_VER) && defined(_DEBUG))
  result_is_ok = (math::wide_integer::example012_rsa_crypto         () && result_is_ok); std::cout << "result_is_ok after example012_rsa_crypto         : " << std::boolalpha << result_is_ok << std::endl;
  #endif
  result_is_ok = (math::wide_integer::example013_ecdsa_sign_verify  () && result_is_ok); std::cout << "result_is_ok after example013_ecdsa_sign_verify  : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example014_pi_spigot_wide     () && result_is_ok); std::cout << "result_is_ok after example014_pi_spigot_wide     : " << std::boolalpha << result_is_ok << std::endl;

  return result_is_ok;
}